

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::AllocateBlock(PF_BufferMgr *this,char **buffer)

{
  int pageNum_00;
  RC RVar1;
  int local_28;
  PageNum pageNum;
  int slot;
  RC rc;
  char **buffer_local;
  PF_BufferMgr *this_local;
  
  pageNum = 0;
  _slot = buffer;
  buffer_local = (char **)this;
  pageNum = InternalAlloc(this,&local_28);
  this_local._4_4_ = pageNum;
  if (pageNum == 0) {
    pageNum_00 = atoi(this->bufTable[local_28].pData);
    RVar1 = PF_HashTable::Insert(&this->hashTable,-1,pageNum_00,local_28);
    pageNum = (PageNum)(RVar1 != 0);
    if ((RVar1 != 0) || (pageNum = InitPageDesc(this,-1,pageNum_00,local_28), pageNum != 0)) {
      Unlink(this,local_28);
      InsertFree(this,local_28);
      this_local._4_4_ = pageNum;
    }
    else {
      *_slot = this->bufTable[local_28].pData;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_BufferMgr::AllocateBlock(char *&buffer)
{
   RC rc = OK_RC;

   // Get an empty slot from the buffer pool
   int slot;
   if ((rc = InternalAlloc(slot)) != OK_RC)
      return rc;

   // Create artificial page number (just needs to be unique for hash table)
   PageNum pageNum = PageNum(atoi(bufTable[slot].pData));

   // Insert the page into the hash table, and initialize the page description entry
   if ((rc = hashTable.Insert(MEMORY_FD, pageNum, slot) != OK_RC) ||
         (rc = InitPageDesc(MEMORY_FD, pageNum, slot)) != OK_RC) {
      // Put the slot back on the free list before returning the error
      Unlink(slot);
      InsertFree(slot);
      return rc;
   }

   // Return pointer to buffer
   buffer = bufTable[slot].pData;

   // Return success code
   return OK_RC;
}